

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internals.h
# Opt level: O2

type_map<type_info_*> * pybind11::detail::registered_local_types_cpp(void)

{
  int iVar1;
  
  if ((registered_local_types_cpp()::locals == '\0') &&
     (iVar1 = __cxa_guard_acquire(&registered_local_types_cpp()::locals), iVar1 != 0)) {
    registered_local_types_cpp::locals._M_h._M_buckets =
         &registered_local_types_cpp::locals._M_h._M_single_bucket;
    registered_local_types_cpp::locals._M_h._M_bucket_count = 1;
    registered_local_types_cpp::locals._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    registered_local_types_cpp::locals._M_h._M_element_count = 0;
    registered_local_types_cpp::locals._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    registered_local_types_cpp::locals._M_h._M_rehash_policy._4_4_ = 0;
    registered_local_types_cpp::locals._M_h._M_rehash_policy._M_next_resize = 0;
    registered_local_types_cpp::locals._M_h._M_single_bucket = (__node_base_ptr)0x0;
    __cxa_atexit(std::
                 unordered_map<std::type_index,_pybind11::detail::type_info_*,_std::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_pybind11::detail::type_info_*>_>_>
                 ::~unordered_map,&registered_local_types_cpp::locals,&__dso_handle);
    __cxa_guard_release(&registered_local_types_cpp()::locals);
  }
  return &registered_local_types_cpp::locals;
}

Assistant:

inline type_map<type_info *> &registered_local_types_cpp() {
    static type_map<type_info *> locals{};
    return locals;
}